

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIntegers.h
# Opt level: O3

double HighsIntegers::integralScale(double *vals,HighsInt numVals,double deltadown,double deltaup)

{
  ulong uVar1;
  int64_t iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  int iVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  pair<const_double_*,_const_double_*> pVar23;
  HighsCDouble HVar24;
  HighsCDouble val;
  int expshift;
  int expMaxVal;
  ulong local_a0;
  HighsCDouble local_80;
  double local_70;
  double local_68;
  int local_5c;
  double local_58;
  double *local_40;
  int local_34;
  
  if (numVals == 0) {
    dVar13 = 0.0;
  }
  else {
    local_58 = deltadown;
    local_40 = vals;
    pVar23 = std::
             __minmax_element<double_const*,__gnu_cxx::__ops::_Iter_comp_iter<HighsIntegers::integralScale(double_const*,int,double,double)::_lambda(double,double)_1_>>
                       (vals,vals + numVals);
    dVar13 = *pVar23.first;
    dVar16 = *pVar23.second;
    local_5c = 0;
    if ((dVar13 < -local_58) || (deltaup < dVar13)) {
      frexp(dVar13,&local_5c);
    }
    iVar12 = 0;
    if (local_5c < 0) {
      iVar12 = -local_5c;
    }
    frexp(dVar16,&local_34);
    pdVar10 = local_40;
    iVar7 = 0x20;
    if (local_34 < 0x20) {
      iVar7 = local_34;
    }
    bVar6 = 0x20 - (char)iVar7;
    if (iVar7 + iVar12 + 3 < 0x21) {
      bVar6 = (char)iVar12 + 3;
    }
    local_a0 = 0x4bL << (bVar6 & 0x3f);
    local_80.hi = *local_40;
    local_80.lo = 0.0;
    HVar24 = HighsCDouble::operator*(&local_80,(double)(long)local_a0);
    local_70 = HVar24.lo;
    local_68 = HVar24.hi;
    local_80.hi = local_68 + deltaup;
    dVar13 = local_80.hi - local_68;
    dVar16 = (deltaup - dVar13) + (local_68 - (local_80.hi - dVar13)) + local_70;
    local_80.lo = dVar16;
    dVar13 = floor(dVar13);
    dVar20 = local_68 - dVar13;
    dVar20 = (((-dVar13 - (dVar20 - local_68)) + (local_68 - (dVar20 - (dVar20 - local_68))) +
              local_70) - dVar16) + dVar20;
    uVar9 = local_a0;
    if (local_58 < dVar20) {
      iVar2 = denominator(dVar20,deltaup,1000);
      uVar9 = iVar2 * local_a0;
      auVar17._8_4_ = (int)(uVar9 >> 0x20);
      auVar17._0_8_ = uVar9;
      auVar17._12_4_ = 0x45300000;
      local_80.hi = *pdVar10;
      local_80.lo = 0.0;
      HVar24 = HighsCDouble::operator*
                         (&local_80,
                          (auVar17._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
      local_70 = HVar24.lo;
      local_68 = HVar24.hi;
      local_80.hi = local_68 + deltaup;
      dVar13 = local_80.hi - local_68;
      dVar16 = (deltaup - dVar13) + (local_68 - (local_80.hi - dVar13)) + local_70;
      local_80.lo = dVar16;
      dVar13 = floor(dVar13);
      dVar20 = local_68 - dVar13;
      if (local_58 <
          (((-dVar13 - (dVar20 - local_68)) + (local_68 - (dVar20 - (dVar20 - local_68))) + local_70
           ) - dVar16) + dVar20) {
        return 0.0;
      }
    }
    uVar3 = (ulong)ABS(dVar13 + dVar16);
    uVar3 = (long)(ABS(dVar13 + dVar16) - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    if (numVals != 1) {
      local_70 = (double)(ulong)(uint)numVals;
      uVar11 = 1;
      uVar4 = uVar3;
      do {
        auVar18._8_4_ = (int)(uVar9 >> 0x20);
        auVar18._0_8_ = uVar9;
        auVar18._12_4_ = 0x45300000;
        local_80.hi = pdVar10[uVar11];
        local_80.lo = 0.0;
        HVar24 = HighsCDouble::operator*
                           (&local_80,
                            (auVar18._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
        dVar21 = HVar24.lo;
        dVar16 = HVar24.hi;
        local_80.hi = dVar16 + deltaup;
        dVar20 = dVar16 - (local_80.hi - (local_80.hi - dVar16));
        local_80.lo = (deltaup - (local_80.hi - dVar16)) + dVar20 + dVar21;
        dVar13 = dVar21;
        dVar20 = floor(dVar20);
        dVar22 = dVar16 - dVar20;
        if (local_58 <
            (((-dVar20 - (dVar22 - dVar16)) + (dVar16 - (dVar22 - (dVar22 - dVar16))) + dVar21) -
            dVar13) + dVar22) {
          local_80.hi = pdVar10[uVar11];
          local_80.lo = 0.0;
          HVar24 = HighsCDouble::operator*(&local_80,(double)(long)local_a0);
          dVar16 = HVar24.hi;
          dVar13 = HVar24.lo;
          dVar20 = floor(dVar16);
          dVar21 = dVar16 - dVar20;
          iVar2 = denominator((((-dVar20 - (dVar21 - dVar16)) +
                                (dVar16 - (dVar21 - (dVar21 - dVar16))) + HVar24.lo) - dVar13) +
                              dVar21,deltaup,1000);
          uVar9 = uVar9 * iVar2;
          auVar19._8_4_ = (int)(uVar9 >> 0x20);
          auVar19._0_8_ = uVar9;
          auVar19._12_4_ = 0x45300000;
          local_80.hi = pdVar10[uVar11];
          local_80.lo = 0.0;
          HVar24 = HighsCDouble::operator*
                             (&local_80,
                              (auVar19._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
          dVar21 = HVar24.lo;
          dVar16 = HVar24.hi;
          local_80.hi = dVar16 + deltaup;
          dVar20 = dVar16 - (local_80.hi - (local_80.hi - dVar16));
          local_80.lo = (deltaup - (local_80.hi - dVar16)) + dVar20 + dVar21;
          dVar13 = dVar21;
          dVar20 = floor(dVar20);
          dVar22 = dVar16 - dVar20;
          pdVar10 = local_40;
          if (local_58 <
              (((-dVar20 - (dVar22 - dVar16)) + (dVar16 - (dVar22 - (dVar22 - dVar16))) + dVar21) -
              dVar13) + dVar22) {
            return 0.0;
          }
        }
        uVar3 = 1;
        if (uVar4 != 1) {
          uVar3 = (ulong)(dVar20 + dVar13);
          uVar5 = -uVar3;
          if (0 < (long)uVar3) {
            uVar5 = uVar3;
          }
          if (uVar4 != 0) {
            uVar1 = -uVar4;
            uVar8 = uVar5;
            if (0 < (long)uVar4) {
              uVar1 = uVar4;
            }
            while (uVar5 = uVar1, uVar3 != 0) {
              uVar3 = uVar5 % uVar8;
              uVar1 = uVar8;
              uVar8 = uVar3;
            }
          }
          uVar3 = uVar5;
          if (uVar9 >> 0x20 != 0) {
            uVar9 = uVar9 / uVar5;
            uVar3 = 1;
            if (local_a0 == 1) {
              local_a0 = 1;
            }
            else {
              uVar4 = -uVar5;
              if (0 < (long)uVar5) {
                uVar4 = uVar5;
              }
              if (local_a0 != 0) {
                uVar5 = uVar4;
                uVar8 = -local_a0;
                if (0 < (long)local_a0) {
                  uVar8 = local_a0;
                }
                do {
                  uVar4 = uVar8;
                  uVar8 = uVar5 % uVar4;
                  uVar5 = uVar4;
                } while (uVar8 != 0);
              }
              local_a0 = (long)local_a0 / (long)uVar4;
            }
          }
        }
        uVar11 = uVar11 + 1;
        uVar4 = uVar3;
      } while ((double)uVar11 != local_70);
    }
    auVar14._8_4_ = (int)(uVar9 >> 0x20);
    auVar14._0_8_ = uVar9;
    auVar14._12_4_ = 0x45300000;
    auVar15._8_4_ = (int)(uVar3 >> 0x20);
    auVar15._0_8_ = uVar3;
    auVar15._12_4_ = 0x45300000;
    dVar13 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) /
             ((auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
  }
  return dVar13;
}

Assistant:

static double integralScale(const double* vals, HighsInt numVals,
                              double deltadown, double deltaup) {
    if (numVals == 0) return 0.0;

    auto minmax = std::minmax_element(
        vals, vals + numVals,
        [](double a, double b) { return std::abs(a) < std::abs(b); });
    const double minval = *minmax.first;
    const double maxval = *minmax.second;

    int expshift = 0;

    // to cover many small denominators at once use a denominator of 75 * 2^n
    // with n-3 being large enough so that the smallest value is not below 0.5
    // but ignore tiny values bew deltadown/deltaup.
    if (minval < -deltadown || minval > deltaup) std::frexp(minval, &expshift);
    expshift = std::max(-expshift, 0) + 3;

    // guard against making the largest value too big which may cause overflows
    // with intermediate gcd values
    int expMaxVal;
    std::frexp(maxval, &expMaxVal);
    expMaxVal = std::min(expMaxVal, 32);
    if (expMaxVal + expshift > 32) expshift = 32 - expMaxVal;

    uint64_t denom = uint64_t{75} << expshift;
    int64_t startdenom = denom;
    // now check if the values are integral and if not compute a common
    // denominator for their remaining fraction
    HighsCDouble val = startdenom * HighsCDouble(vals[0]);
    HighsCDouble downval = floor(val + deltaup);
    HighsCDouble fraction = val - downval;

    if (fraction > deltadown) {
      // use a continued fraction algorithm to compute small missing
      // denominators for the remaining fraction
      denom *= denominator(double(fraction), deltaup, 1000);
      val = denom * HighsCDouble(vals[0]);
      downval = floor(val + deltaup);
      fraction = val - downval;

      // if this is not sufficient for reaching integrality, we stop here
      if (fraction > deltadown) return 0.0;
    }

    uint64_t currgcd = (uint64_t)std::abs(double(downval));

    for (HighsInt i = 1; i != numVals; ++i) {
      val = denom * HighsCDouble(vals[i]);
      downval = floor(val + deltaup);
      fraction = val - downval;

      if (fraction > deltadown) {
        val = startdenom * HighsCDouble(vals[i]);
        fraction = val - floor(val);
        denom *= denominator(double(fraction), deltaup, 1000);
        val = denom * HighsCDouble(vals[i]);
        downval = floor(val + deltaup);
        fraction = val - downval;

        if (fraction > deltadown) return 0.0;
      }

      if (currgcd != 1) {
        currgcd = gcd(currgcd, (int64_t) double(downval));

        // if the denominator is large, divide by the current gcd to prevent
        // unnecessary overflows
        if (denom > std::numeric_limits<unsigned int>::max()) {
          denom /= currgcd;
          if (startdenom != 1) startdenom /= gcd(currgcd, startdenom);
          currgcd = 1;
        }
      }
    }

    return static_cast<double>(denom) / static_cast<double>(currgcd);
  }